

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::EqExp(SQCompiler *this)

{
  long lVar1;
  SQCompiler *this_local;
  
  CompExp(this);
  while( true ) {
    while( true ) {
      while (lVar1 = this->_token, lVar1 == 0x108) {
        BIN_EXP<void(SQCompiler::*)()>(this,_OP_EQ,0x1232e0,0);
      }
      if (lVar1 != 0x109) break;
      BIN_EXP<void(SQCompiler::*)()>(this,_OP_NE,0x1232e0,0);
    }
    if (lVar1 != 0x131) break;
    BIN_EXP<void(SQCompiler::*)()>(this,_OP_CMP,0x1232e0,0);
  }
  return;
}

Assistant:

void EqExp()
    {
        CompExp();
        for(;;) switch(_token) {
        case TK_EQ: BIN_EXP(_OP_EQ, &SQCompiler::CompExp); break;
        case TK_NE: BIN_EXP(_OP_NE, &SQCompiler::CompExp); break;
        case TK_3WAYSCMP: BIN_EXP(_OP_CMP, &SQCompiler::CompExp,CMP_3W); break;
        default: return;
        }
    }